

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O1

void __thiscall
QFontEngineMulti::setFallbackFamiliesList(QFontEngineMulti *this,QStringList *fallbackFamilies)

{
  QAtomicInt *pQVar1;
  QStringList *this_00;
  long lVar2;
  QFontEngine *pQVar3;
  pointer ppQVar4;
  
  this_00 = &this->m_fallbackFamilies;
  QArrayDataPointer<QString>::operator=(&this_00->d,&fallbackFamilies->d);
  lVar2 = (this->m_fallbackFamilies).d.size;
  if (lVar2 == 0) {
    pQVar3 = *(this->m_engines).d.ptr;
    LOCK();
    pQVar1 = &pQVar3->ref;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    ppQVar4 = QList<QFontEngine_*>::data(&this->m_engines);
    ppQVar4[1] = pQVar3;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)this_00,(this->m_fallbackFamilies).d.size,
               (this->super_QFontEngine).fontDef.families.d.ptr);
    QList<QString>::end(this_00);
  }
  else {
    QList<QFontEngine_*>::resize(&this->m_engines,lVar2 + 1);
  }
  this->m_fallbackFamiliesQueried = true;
  return;
}

Assistant:

void QFontEngineMulti::setFallbackFamiliesList(const QStringList &fallbackFamilies)
{
    Q_ASSERT(!m_fallbackFamiliesQueried);

    m_fallbackFamilies = fallbackFamilies;
    if (m_fallbackFamilies.isEmpty()) {
        // turns out we lied about having any fallback at all
        Q_ASSERT(m_engines.size() == 2); // see c-tor for details
        QFontEngine *engine = m_engines.at(0);
        engine->ref.ref();
        m_engines[1] = engine;
        m_fallbackFamilies << fontDef.families.constFirst();
    } else {
        m_engines.resize(m_fallbackFamilies.size() + 1);
    }

    m_fallbackFamiliesQueried = true;
}